

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

TypedExpectation<int_(int,_int,_int)> * __thiscall
testing::internal::TypedExpectation<int_(int,_int,_int)>::Times
          (TypedExpectation<int_(int,_int,_int)> *this,int n)

{
  testing local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  Exactly(local_20,n);
  ExpectationBase::UntypedTimes(&this->super_ExpectationBase,(Cardinality *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return this;
}

Assistant:

TypedExpectation& Times(int n) {
    return Times(Exactly(n));
  }